

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  XXH64_state_t *state_in;
  long lVar1;
  byte bVar2;
  undefined1 *puVar3;
  bool bVar4;
  byte bVar5;
  ZSTD_ErrorCode ZVar6;
  size_t sVar7;
  XXH64_state_t *len;
  XXH64_hash_t XVar8;
  ulong uVar9;
  uint *puVar10;
  ulong uVar11;
  XXH64_state_t *__n;
  uint uVar12;
  int iVar13;
  char cVar15;
  void *pvVar16;
  XXH64_state_t *pXVar17;
  XXH64_state_t *headerSize;
  XXH64_state_t *pXVar18;
  void *pvVar19;
  ulong in_R11;
  uint *puVar20;
  uint uVar21;
  XXH64_state_t *unaff_R13;
  XXH64_state_t *__n_00;
  size_t local_40;
  XXH64_state_t *pXVar14;
  
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ddict->dictContent;
    dictSize = ddict->dictSize;
  }
  state_in = &dctx->xxhState;
  bVar5 = 0;
  pXVar17 = state_in;
  local_40 = dstCapacity;
  pvVar16 = dst;
  do {
    do {
      if (srcSize < 5) {
        if (srcSize != 0) {
          return 0xffffffffffffffb8;
        }
        return (long)pvVar16 - (long)dst;
      }
      iVar13 = 0;
      uVar11 = srcSize;
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        iVar13 = 1;
        if (7 < srcSize) {
          uVar9 = (ulong)*(uint *)((long)src + 4) + 8;
          uVar11 = srcSize - uVar9;
          if (uVar9 <= srcSize) {
            src = (void *)((long)src + uVar9);
            iVar13 = 2;
            goto LAB_0015cc35;
          }
        }
        pXVar17 = (XXH64_state_t *)0xffffffffffffffb8;
        uVar11 = srcSize;
      }
LAB_0015cc35:
      srcSize = uVar11;
    } while (iVar13 == 2);
    if (iVar13 != 0) {
      return (size_t)pXVar17;
    }
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar7 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
      if (0xffffffffffffff88 < sVar7) {
        return sVar7;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    pvVar19 = dctx->previousDstEnd;
    if (pvVar19 != pvVar16) {
      dctx->dictEnd = pvVar19;
      dctx->vBase = (void *)(((long)dctx->base - (long)pvVar19) + (long)pvVar16);
      dctx->base = pvVar16;
      dctx->previousDstEnd = pvVar16;
    }
    puVar20 = (uint *)src;
    if (uVar11 < 9) {
      unaff_R13 = (XXH64_state_t *)0xffffffffffffffb8;
    }
    else {
      bVar2 = (byte)*(uint *)((long)src + 4);
      lVar1 = ZSTD_did_fieldSize[bVar2 & 3] +
              *(long *)((long)ZSTD_fcs_fieldSize + (ulong)(bVar2 >> 3 & 0x18)) +
              (ulong)((bVar2 & 0x20) == 0) + (ulong)(bVar2 < 0x40 & (byte)((bVar2 & 0x20) >> 5));
      headerSize = (XXH64_state_t *)(lVar1 + 5);
      pXVar18 = headerSize;
      puVar10 = (uint *)src;
      uVar9 = uVar11;
      if (headerSize < (XXH64_state_t *)0xffffffffffffff89) {
        if (uVar11 < lVar1 + 8U) {
          pXVar18 = (XXH64_state_t *)0xffffffffffffffb8;
          goto LAB_0015cd33;
        }
        pXVar18 = (XXH64_state_t *)ZSTD_decodeFrameHeader(dctx,src,(size_t)headerSize);
        bVar4 = pXVar18 < (XXH64_state_t *)0xffffffffffffff89;
        if (bVar4) {
          puVar10 = (uint *)((long)src + (long)headerSize);
          uVar9 = uVar11 - (long)headerSize;
        }
      }
      else {
LAB_0015cd33:
        bVar4 = false;
        headerSize = unaff_R13;
      }
      pXVar14 = (XXH64_state_t *)dst;
      unaff_R13 = pXVar18;
      pvVar19 = pvVar16;
      if (bVar4) {
        do {
          __n_00 = (XXH64_state_t *)0xffffffffffffffb8;
          if (2 < uVar9) {
            uVar21 = (uint)(uint3)((uint3)*puVar10 >> 3);
            headerSize = (XXH64_state_t *)(ulong)uVar21;
            in_R11 = (ulong)((ushort)*puVar10 & 1);
            uVar12 = (ushort)((ushort)*puVar10 >> 1) & 3;
            pXVar14 = (XXH64_state_t *)(ulong)uVar12;
            __n_00 = pXVar14;
            if (uVar12 != 1) {
              if (uVar12 == 3) {
                __n_00 = (XXH64_state_t *)0xffffffffffffffec;
              }
              else {
                __n_00 = (XXH64_state_t *)(ulong)uVar21;
              }
            }
          }
          cVar15 = '\x01';
          len = __n_00;
          if (__n_00 < (XXH64_state_t *)0xffffffffffffff89) {
            puVar10 = (uint *)((long)puVar10 + 3);
            uVar9 = uVar9 - 3;
            if (uVar9 < __n_00) {
              len = (XXH64_state_t *)0xffffffffffffffb8;
            }
            else {
              iVar13 = (int)pXVar14;
              if (iVar13 == 0) {
                len = (XXH64_state_t *)0xffffffffffffffba;
                if (__n_00 <= (undefined1 *)((long)pvVar16 + (local_40 - (long)pvVar19))) {
                  memcpy(pvVar19,puVar10,(size_t)__n_00);
                  in_R11 = in_R11 & 0xffffffff;
                  len = __n_00;
                }
              }
              else if (iVar13 == 1) {
                __n = (XXH64_state_t *)((ulong)headerSize & 0xffffffff);
                len = (XXH64_state_t *)0xffffffffffffffba;
                if (__n <= (undefined1 *)((long)pvVar16 + (local_40 - (long)pvVar19))) {
                  memset(pvVar19,(uint)*(byte *)puVar10,(size_t)__n);
                  in_R11 = in_R11 & 0xffffffff;
                  len = __n;
                }
              }
              else {
                if (iVar13 != 2) {
                  len = (XXH64_state_t *)0xffffffffffffffec;
                  goto LAB_0015ce07;
                }
                len = (XXH64_state_t *)
                      ZSTD_decompressBlock_internal
                                (dctx,pvVar19,(long)pvVar16 + (local_40 - (long)pvVar19),puVar10,
                                 (size_t)__n_00,1);
                in_R11 = in_R11 & 0xffffffff;
              }
              if (len < (XXH64_state_t *)0xffffffffffffff89) {
                if ((dctx->fParams).checksumFlag != 0) {
                  XXH64_update(state_in,pvVar19,(size_t)len);
                  in_R11 = in_R11 & 0xffffffff;
                }
                pvVar19 = (void *)((long)pvVar19 + (long)len);
                puVar10 = (uint *)((long)puVar10 + (long)__n_00);
                cVar15 = ((int)in_R11 != 0) * '\x03';
                uVar9 = uVar9 - (long)__n_00;
                len = pXVar18;
              }
            }
          }
LAB_0015ce07:
          pXVar18 = len;
        } while (cVar15 == '\0');
        unaff_R13 = len;
        if (cVar15 == '\x03') {
          puVar3 = (undefined1 *)(dctx->fParams).frameContentSize;
          pXVar18 = (XXH64_state_t *)((long)pvVar19 - (long)pvVar16);
          if ((puVar3 == (undefined1 *)0xffffffffffffffff) || (pXVar18 == (XXH64_state_t *)puVar3))
          {
            unaff_R13 = pXVar18;
            puVar20 = puVar10;
            srcSize = uVar9;
            if ((dctx->fParams).checksumFlag != 0) {
              XVar8 = XXH64_digest(state_in);
              unaff_R13 = (XXH64_state_t *)0xffffffffffffffea;
              if (uVar9 < 4) {
                bVar4 = false;
              }
              else if (*puVar10 == (uint)XVar8) {
                puVar10 = puVar10 + 1;
                uVar9 = uVar9 - 4;
                bVar4 = true;
                unaff_R13 = len;
              }
              else {
                bVar4 = false;
              }
              puVar20 = (uint *)src;
              srcSize = uVar11;
              if (bVar4) {
                unaff_R13 = pXVar18;
                puVar20 = puVar10;
                srcSize = uVar9;
              }
            }
          }
          else {
            unaff_R13 = (XXH64_state_t *)0xffffffffffffffec;
          }
        }
      }
    }
    ZVar6 = ZSTD_getErrorCode((size_t)unaff_R13);
    if ((bool)(bVar5 & ZVar6 == ZSTD_error_prefix_unknown)) {
      bVar4 = false;
      pXVar17 = (XXH64_state_t *)0xffffffffffffffb8;
    }
    else if (unaff_R13 < (XXH64_state_t *)0xffffffffffffff89) {
      pvVar16 = (void *)((long)pvVar16 + (long)unaff_R13);
      local_40 = local_40 - (long)unaff_R13;
      bVar4 = true;
    }
    else {
      bVar4 = false;
      pXVar17 = unaff_R13;
    }
    bVar5 = 1;
    src = puVar20;
    if (!bVar4) {
      return (size_t)pXVar17;
    }
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDictDictContent(ddict);
        dictSize = ZSTD_DDictDictSize(ddict);
    }

    while (srcSize >= ZSTD_frameHeaderSize_prefix) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            /* legacy support is not compatible with static dctx */
            if (dctx->staticSize) return ERROR(memory_allocation);

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);

            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (U32)magicNumber, (U32)ZSTD_MAGICNUMBER);
            if ((magicNumber & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t skippableSize;
                if (srcSize < ZSTD_skippableHeaderSize)
                    return ERROR(srcSize_wrong);
                skippableSize = MEM_readLE32((const BYTE*)src + ZSTD_frameIdSize)
                              + ZSTD_skippableHeaderSize;
                if (srcSize < skippableSize) return ERROR(srcSize_wrong);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            CHECK_F(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            CHECK_F(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            if ( (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
              && (moreThan1Frame==1) ) {
                /* at least one frame successfully completed,
                 * but following bytes are garbage :
                 * it's more likely to be a srcSize error,
                 * specifying more bytes than compressed size of frame(s).
                 * This error message replaces ERROR(prefix_unknown),
                 * which would be confusing, as the first header is actually correct.
                 * Note that one could be unlucky, it might be a corruption error instead,
                 * happening right at the place where we expect zstd magic bytes.
                 * But this is _much_ less likely than a srcSize field error. */
                return ERROR(srcSize_wrong);
            }
            if (ZSTD_isError(res)) return res;
            /* no need to bound check, ZSTD_decompressFrame already has */
            dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ERROR(srcSize_wrong); /* input not entirely consumed */

    return (BYTE*)dst - (BYTE*)dststart;
}